

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O1

int dec_mem(em8051 *aCPU)

{
  byte bVar1;
  
  bVar1 = aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC + 1U];
  if ((char)bVar1 < '\0') {
    aCPU->mSFR[(ulong)bVar1 - 0x80] = aCPU->mSFR[(ulong)bVar1 - 0x80] + 0xff;
    if (aCPU->sfrwrite != (em8051sfrwrite)0x0) {
      (*aCPU->sfrwrite)(aCPU,(uint)bVar1);
    }
  }
  else {
    aCPU->mLowerData[bVar1] = aCPU->mLowerData[bVar1] + 0xff;
  }
  aCPU->mPC = aCPU->mPC + 2;
  return 0;
}

Assistant:

static int dec_mem(struct em8051 *aCPU)
{
    int address = OPERAND1;
    if (address > 0x7f)
    {
        aCPU->mSFR[address - 0x80]--;
        if (aCPU->sfrwrite)
            aCPU->sfrwrite(aCPU, address);
    }
    else
    {
        aCPU->mLowerData[address]--;
    }
    PC += 2;
    return 0;
}